

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline_int8_x86(ConvolutionDepthWise_x86 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Allocator **ppAVar8;
  byte *in_RSI;
  Mat *in_RDI;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_000006f0;
  ConvolutionDepthWise_x86 *in_stack_000006f8;
  Option *opt_00;
  Mat *pMVar9;
  undefined4 in_stack_fffffffffffffedc;
  Mat *in_stack_fffffffffffffee0;
  void *local_118;
  Allocator *local_110;
  Allocator *local_108;
  int local_100;
  long *local_f8;
  int local_f0;
  undefined4 local_ec;
  int local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined8 local_d8;
  int local_cc;
  
  iVar5 = *(int *)((long)&in_RDI[2].cstep + 4) * *(int *)&in_RDI[3].data;
  uVar3 = (long)in_RDI[3].w / (long)in_RDI[3].h;
  iVar6 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) / (long)iVar5
               );
  iVar7 = (iVar6 / ((int)in_RDI[2].cstep / in_RDI[3].h)) * in_RDI[3].h;
  if ((iVar7 == in_RDI[3].h) && (in_RDI[3].h == (int)in_RDI[2].cstep)) {
    local_cc = 1;
    if (((in_RSI[0x27] & 1) != 0) && (local_cc = 1, iVar7 % 8 == 0)) {
      local_cc = 8;
    }
    if (local_cc == 8) {
      opt_00 = (Option *)&local_118;
      Mat::reshape(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                   (Allocator *)CONCAT44(iVar5,iVar7));
      convert_packing(in_stack_fffffffffffffee0,(Mat *)CONCAT44(in_stack_fffffffffffffedc,iVar6),
                      (int)((ulong)in_RDI >> 0x20),opt_00);
      if (local_110 != (Allocator *)0x0) {
        LOCK();
        iVar5 = *(int *)&local_110->_vptr_Allocator;
        *(int *)&local_110->_vptr_Allocator = *(int *)&local_110->_vptr_Allocator + -1;
        UNLOCK();
        if (iVar5 == 1) {
          if (local_f8 == (long *)0x0) {
            if (local_118 != (void *)0x0) {
              free(local_118);
            }
          }
          else {
            (**(code **)(*local_f8 + 0x18))(local_f8,local_118);
          }
        }
      }
      local_118 = (void *)0x0;
      local_108 = (Allocator *)0x0;
      local_100 = 0;
      local_f0 = 0;
      local_ec._0_1_ = false;
      local_ec._1_1_ = false;
      local_ec._2_1_ = false;
      local_ec._3_1_ = false;
      local_e8 = 0;
      local_e4._0_1_ = false;
      local_e4._1_1_ = false;
      local_e4._2_1_ = false;
      local_e4._3_1_ = false;
      local_e0._0_1_ = false;
      local_e0._1_1_ = false;
      local_e0._2_1_ = false;
      local_e0._3_1_ = false;
      local_d8 = 0;
      local_110 = (Allocator *)0x0;
    }
    if (local_cc == 1) {
      ppAVar8 = &in_RDI[10].allocator;
      if ((Mat *)ppAVar8 != in_RDI + 5) {
        if (in_RDI[5].refcount != (int *)0x0) {
          LOCK();
          *in_RDI[5].refcount = *in_RDI[5].refcount + 1;
          UNLOCK();
        }
        lVar1._0_4_ = in_RDI[10].dims;
        lVar1._4_4_ = in_RDI[10].w;
        pMVar9 = in_RDI;
        if (lVar1 != 0) {
          piVar2 = *(int **)&in_RDI[10].dims;
          LOCK();
          iVar5 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (iVar5 == 1) {
            if (in_RDI[10].cstep == 0) {
              if (*ppAVar8 != (Allocator *)0x0) {
                free(*ppAVar8);
              }
            }
            else {
              (**(code **)(*(long *)in_RDI[10].cstep + 0x18))((long *)in_RDI[10].cstep,*ppAVar8);
            }
          }
        }
        *ppAVar8 = (Allocator *)0x0;
        in_RDI[10].h = 0;
        in_RDI[10].d = 0;
        in_RDI[10].c = 0;
        *(undefined4 *)&in_RDI[0xb].data = 0;
        *(undefined4 *)((long)&in_RDI[0xb].data + 4) = 0;
        *(undefined4 *)&in_RDI[0xb].refcount = 0;
        *(undefined4 *)((long)&in_RDI[0xb].refcount + 4) = 0;
        *(undefined4 *)&in_RDI[0xb].elemsize = 0;
        *(undefined8 *)&in_RDI[0xb].elempack = 0;
        in_RDI[10].dims = 0;
        in_RDI[10].w = 0;
        *ppAVar8 = (Allocator *)in_RDI[5].data;
        *(int **)&in_RDI[10].dims = in_RDI[5].refcount;
        uVar4 = *(undefined4 *)((long)&in_RDI[5].elemsize + 4);
        in_RDI[10].h = *(undefined4 *)&in_RDI[5].elemsize;
        in_RDI[10].d = uVar4;
        in_RDI[10].c = in_RDI[5].elempack;
        in_RDI[10].cstep = (size_t)in_RDI[5].allocator;
        *(int *)&in_RDI[0xb].data = in_RDI[5].dims;
        *(int *)((long)&in_RDI[0xb].data + 4) = in_RDI[5].w;
        *(int *)&in_RDI[0xb].refcount = in_RDI[5].h;
        *(int *)((long)&in_RDI[0xb].refcount + 4) = in_RDI[5].d;
        *(int *)&in_RDI[0xb].elemsize = in_RDI[5].c;
        *(size_t *)&in_RDI[0xb].elempack = in_RDI[5].cstep;
        in_RDI = pMVar9;
      }
    }
    if ((*in_RSI & 1) != 0) {
      pMVar9 = in_RDI + 5;
      if (in_RDI[5].refcount != (int *)0x0) {
        piVar2 = in_RDI[5].refcount;
        LOCK();
        iVar5 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar5 == 1) {
          if (in_RDI[5].allocator == (Allocator *)0x0) {
            if (pMVar9->data != (void *)0x0) {
              free(pMVar9->data);
            }
          }
          else {
            (*(in_RDI[5].allocator)->_vptr_Allocator[3])(in_RDI[5].allocator,pMVar9->data);
          }
        }
      }
      pMVar9->data = (void *)0x0;
      in_RDI[5].elemsize = 0;
      in_RDI[5].elempack = 0;
      in_RDI[5].dims = 0;
      in_RDI[5].w = 0;
      in_RDI[5].h = 0;
      in_RDI[5].d = 0;
      in_RDI[5].c = 0;
      in_RDI[5].cstep = 0;
      in_RDI[5].refcount = (int *)0x0;
    }
  }
  else {
    create_group_ops(in_stack_000006f8,in_stack_000006f0);
    if ((*in_RSI & 1) != 0) {
      pMVar9 = in_RDI + 5;
      if (in_RDI[5].refcount != (int *)0x0) {
        piVar2 = in_RDI[5].refcount;
        LOCK();
        iVar5 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (iVar5 == 1) {
          if (in_RDI[5].allocator == (Allocator *)0x0) {
            if (pMVar9->data != (void *)0x0) {
              free(pMVar9->data);
            }
          }
          else {
            (*(in_RDI[5].allocator)->_vptr_Allocator[3])(in_RDI[5].allocator,pMVar9->data);
          }
        }
      }
      pMVar9->data = (void *)0x0;
      in_RDI[5].elemsize = 0;
      in_RDI[5].elempack = 0;
      in_RDI[5].dims = 0;
      in_RDI[5].w = 0;
      in_RDI[5].h = 0;
      in_RDI[5].d = 0;
      in_RDI[5].c = 0;
      in_RDI[5].cstep = 0;
      in_RDI[5].refcount = (int *)0x0;
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            elempack = channels % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__

        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }

        if (elempack == 1)
        {
            weight_data_tm = weight_data;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}